

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseMarkupDecl(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  
  pxVar2 = ctxt->input;
  if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  if (*pxVar3 == '<') {
    if (pxVar3[1] == '?') {
      xmlParsePI(ctxt);
      return;
    }
    if (pxVar3[1] == '!') {
      bVar1 = pxVar3[2];
      if (bVar1 < 0x45) {
        if (bVar1 == 0x2d) {
          xmlParseComment(ctxt);
          return;
        }
        if (bVar1 == 0x41) {
          xmlParseAttributeListDecl(ctxt);
          return;
        }
      }
      else {
        if (bVar1 == 0x4e) {
          xmlParseNotationDecl(ctxt);
          return;
        }
        if (bVar1 == 0x45) {
          if (pxVar3[3] == 'N') {
            xmlParseEntityDecl(ctxt);
            return;
          }
          if (pxVar3[3] == 'L') {
            xmlParseElementDecl(ctxt);
            return;
          }
        }
      }
      pxVar2->cur = pxVar3 + 2;
      pxVar2->col = pxVar2->col + 2;
      if (pxVar3[2] == '\0') {
        xmlParserGrow(ctxt);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlParseMarkupDecl(xmlParserCtxtPtr ctxt) {
    GROW;
    if (CUR == '<') {
        if (NXT(1) == '!') {
	    switch (NXT(2)) {
	        case 'E':
		    if (NXT(3) == 'L')
			xmlParseElementDecl(ctxt);
		    else if (NXT(3) == 'N')
			xmlParseEntityDecl(ctxt);
                    else
                        SKIP(2);
		    break;
	        case 'A':
		    xmlParseAttributeListDecl(ctxt);
		    break;
	        case 'N':
		    xmlParseNotationDecl(ctxt);
		    break;
	        case '-':
		    xmlParseComment(ctxt);
		    break;
		default:
		    /* there is an error but it will be detected later */
                    SKIP(2);
		    break;
	    }
	} else if (NXT(1) == '?') {
	    xmlParsePI(ctxt);
	}
    }
}